

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

bool __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::insert_internal
          (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k,value_type v)

{
  value_view v_00;
  value_view v_01;
  value_view v_02;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_00;
  bool bVar1;
  node_type type;
  int iVar2;
  pointer ptr;
  header_type *phVar3;
  reference pvVar4;
  value_type local_161;
  basic_node_ptr<unodb::detail::node_header> local_160;
  undefined1 local_158 [8];
  db_inode_unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte>_>_>
  new_node_1;
  undefined1 local_130 [8];
  basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db> leaf_2
  ;
  uint local_118;
  byte local_111;
  uint shared_prefix_len;
  key_prefix_size key_prefix_length;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *key_prefix;
  inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode;
  undefined1 local_e8 [8];
  db_inode_unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte>_>_> new_node;
  undefined1 local_c0 [8];
  basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db>
  new_leaf;
  undefined1 auStack_98 [4];
  int cmp;
  key_view existing_key;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *leaf_1;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aStack_78;
  node_type node_type;
  art_key_type remaining_key;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *pdStack_68;
  tree_depth_type depth;
  node_ptr *node;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_58;
  pointer local_50;
  size_t local_48;
  undefined1 local_40 [8];
  basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db> leaf;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  value_type v_local;
  art_key_type k_local;
  
  v_local._M_ptr = (pointer)v._M_extent._M_extent_value;
  this_local = (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)v._M_ptr;
  leaf._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
  ._M_head_impl = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)this;
  v_local._M_extent._M_extent_value = (size_t)k.field_0;
  bVar1 = detail::basic_node_ptr<unodb::detail::node_header>::operator==(&this->root,(nullptr_t)0x0)
  ;
  if (bVar1) {
    local_48 = v_local._M_extent._M_extent_value;
    local_58 = this_local;
    local_50 = v_local._M_ptr;
    v_02._M_extent._M_extent_value = (size_t)v_local._M_ptr;
    v_02._M_ptr = (pointer)this_local;
    detail::
    basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
    ::make_db_leaf_ptr((basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
                        *)local_40,(art_key_type)v_local._M_extent._M_extent_value,v_02,this);
    ptr = std::
          unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::release((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)local_40);
    detail::basic_node_ptr<unodb::detail::node_header>::basic_node_ptr
              ((basic_node_ptr<unodb::detail::node_header> *)&node,(header_type *)ptr,LEAF);
    (this->root).tagged_ptr = (uintptr_t)node;
    k_local.field_0.key_bytes._M_elems[7] = 1;
    std::
    unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_40);
  }
  else {
    pdStack_68 = this;
    detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>_>::tree_depth
              ((tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
               ((long)&remaining_key.field_0 + 4),0);
    aStack_78.key_bytes._M_elems =
         (array<std::byte,_8UL>)(array<std::byte,_8UL>)v_local._M_extent._M_extent_value;
    while (type = detail::basic_node_ptr<unodb::detail::node_header>::type(&pdStack_68->root),
          type != LEAF) {
      if (type == LEAF) {
        __assert_fail("node_type != node_type::LEAF",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x3bd,
                      "bool unodb::db<unsigned long, std::span<const std::byte>>::insert_internal(art_key_type, value_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                     );
      }
      key_prefix = (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                    *)detail::basic_node_ptr<unodb::detail::node_header>::
                      ptr<unodb::detail::inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                                (&pdStack_68->root);
      _shared_prefix_len =
           detail::
           basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
           ::get_key_prefix((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                             *)&key_prefix->f);
      local_111 = detail::
                  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                  ::length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                            *)&_shared_prefix_len->f);
      leaf_2._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
      ._M_head_impl =
           (basic_leaf<unsigned_long,_unodb::detail::node_header> *)aStack_78.key_bytes._M_elems;
      local_118 = detail::
                  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                  ::get_shared_length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                                       *)&_shared_prefix_len->f,
                                      (basic_art_key<unsigned_long>)aStack_78.key_bytes._M_elems);
      if (local_118 < local_111) {
        new_node_1._M_t.
        super___uniq_ptr_impl<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        .
        super__Head_base<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
        ._M_head_impl =
             (inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
             this_local;
        v_00._M_extent._M_extent_value = (size_t)v_local._M_ptr;
        v_00._M_ptr = (pointer)this_local;
        detail::
        basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
        ::make_db_leaf_ptr((basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
                            *)local_130,(art_key_type)v_local._M_extent._M_extent_value,v_00,this);
        detail::
        basic_inode<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
        ::
        create<unodb::detail::basic_node_ptr<unodb::detail::node_header>&,unsigned_int_const&,unodb::detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>>&,std::unique_ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>,unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>>
                  ((basic_inode<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                    *)local_158,this,&pdStack_68->root,&local_118,
                   (tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
                   ((long)&remaining_key.field_0 + 4),
                   (unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    *)local_130);
        phVar3 = (header_type *)
                 std::
                 unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ::release((unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                            *)local_158);
        detail::basic_node_ptr<unodb::detail::node_header>::basic_node_ptr(&local_160,phVar3,I4);
        (pdStack_68->root).tagged_ptr = local_160.tagged_ptr;
        account_growing_inode<(unodb::node_type)1>(this);
        this->key_prefix_splits = this->key_prefix_splits + 1;
        pvVar4 = std::array<unsigned_long,_4UL>::operator[](&this->growing_inode_counts,0);
        if (this->key_prefix_splits < *pvVar4) {
          std::
          unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)local_158);
          std::
          unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)local_130);
          return true;
        }
        __assert_fail("growing_inode_counts[internal_as_i<node_type::I4>] > key_prefix_splits",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x3d0,
                      "bool unodb::db<unsigned long, std::span<const std::byte>>::insert_internal(art_key_type, value_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                     );
      }
      if (local_118 != local_111) {
        __assert_fail("shared_prefix_len == key_prefix_length",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x3d6,
                      "bool unodb::db<unsigned long, std::span<const std::byte>>::insert_internal(art_key_type, value_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                     );
      }
      detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>_>::operator+=
                ((tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
                 ((long)&remaining_key.field_0 + 4),(uint)local_111);
      detail::basic_art_key<unsigned_long>::shift_right
                ((basic_art_key<unsigned_long> *)&stack0xffffffffffffff88,(ulong)local_111);
      this_00 = key_prefix;
      local_161 = detail::basic_art_key<unsigned_long>::operator[]
                            ((basic_art_key<unsigned_long> *)&stack0xffffffffffffff88,0);
      pdStack_68 = (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                   detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                   ::
                   add_or_choose_subtree<unodb::detail::basic_node_ptr<unodb::detail::node_header>*,std::byte,unodb::detail::basic_art_key<unsigned_long>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                             ((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                               *)&this_00->f,type,&local_161,
                              (basic_art_key<unsigned_long> *)&v_local._M_extent,
                              (span<const_std::byte,_18446744073709551615UL> *)&this_local,this,
                              (tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
                              ((long)&remaining_key.field_0 + 4),
                              (basic_node_ptr<unodb::detail::node_header> **)
                              &stack0xffffffffffffff98);
      if (pdStack_68 ==
          (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0) {
        return true;
      }
      detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>_>::operator++
                ((tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
                 ((long)&remaining_key.field_0 + 4));
      detail::basic_art_key<unsigned_long>::shift_right
                ((basic_art_key<unsigned_long> *)&stack0xffffffffffffff88,1);
    }
    existing_key._M_extent._M_extent_value =
         (size_t)detail::basic_node_ptr<unodb::detail::node_header>::
                 ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>*>
                           (&pdStack_68->root);
    _auStack_98 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::get_key_view
                            ((basic_leaf<unsigned_long,_unodb::detail::node_header> *)
                             existing_key._M_extent._M_extent_value);
    new_leaf._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
    ._M_head_impl = _auStack_98;
    iVar2 = detail::basic_art_key<unsigned_long>::cmp
                      ((basic_art_key<unsigned_long> *)&v_local._M_extent,_auStack_98,
                       existing_key._M_ptr);
    if (iVar2 == 0) {
      k_local.field_0.key_bytes._M_elems[7] = 0;
    }
    else {
      new_node._M_t.
      super___uniq_ptr_impl<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
      ._M_head_impl =
           (inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this_local
      ;
      v_01._M_extent._M_extent_value = (size_t)v_local._M_ptr;
      v_01._M_ptr = (pointer)this_local;
      detail::
      basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
      ::make_db_leaf_ptr((basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
                          *)local_c0,(art_key_type)v_local._M_extent._M_extent_value,v_01,this);
      detail::
      basic_inode<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
      ::
      create<std::span<std::byte_const,18446744073709551615ul>const&,unodb::detail::basic_art_key<unsigned_long>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>>&,unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>*const&,std::unique_ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>,unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>>
                ((basic_inode<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                  *)local_e8,this,(span<const_std::byte,_18446744073709551615UL> *)auStack_98,
                 (basic_art_key<unsigned_long> *)&stack0xffffffffffffff88,
                 (tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
                 ((long)&remaining_key.field_0 + 4),
                 (basic_leaf<unsigned_long,_unodb::detail::node_header> **)&existing_key._M_extent,
                 (unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  *)local_c0);
      phVar3 = (header_type *)
               std::
               unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               ::release((unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          *)local_e8);
      detail::basic_node_ptr<unodb::detail::node_header>::basic_node_ptr
                ((basic_node_ptr<unodb::detail::node_header> *)&inode,phVar3,I4);
      (pdStack_68->root).tagged_ptr = (uintptr_t)inode;
      account_growing_inode<(unodb::node_type)1>(this);
      k_local.field_0.key_bytes._M_elems[7] = 1;
      std::
      unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)local_e8);
      std::
      unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)local_c0);
    }
  }
  return (bool)k_local.field_0.key_bytes._M_elems[7];
}

Assistant:

bool db<Key, Value>::insert_internal(art_key_type k, value_type v) {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) {
    auto leaf = art_policy::make_db_leaf_ptr(k, v, *this);
    root = detail::node_ptr{leaf.release(), node_type::LEAF};
    return true;
  }

  auto* node = &root;
  tree_depth_type depth{};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node->type();
    if (node_type == node_type::LEAF) {
      auto* const leaf{node->template ptr<leaf_type*>()};
      const auto existing_key{leaf->get_key_view()};
      const auto cmp = k.cmp(existing_key);
      if (UNODB_DETAIL_UNLIKELY(cmp == 0)) {
        return false;  // exists
      }
      // Replace the existing leaf with a new N4 and put the existing
      // leaf and the leaf for the caller's key and value under the
      // new inode as its direct children.
      auto new_leaf = art_policy::make_db_leaf_ptr(k, v, *this);
      auto new_node{inode_4::create(*this, existing_key, remaining_key, depth,
                                    leaf, std::move(new_leaf))};
      *node = detail::node_ptr{new_node.release(), node_type::I4};
#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
#endif  // UNODB_DETAIL_WITH_STATS
      return true;
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node->template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_len{key_prefix.get_shared_length(remaining_key)};
    if (shared_prefix_len < key_prefix_length) {
      // We have reached an existing inode whose key_prefix is greater
      // than the desired match.  We need to split this inode into a
      // new N4 whose children are the existing inode and a new child
      // leaf.
      auto leaf = art_policy::make_db_leaf_ptr(k, v, *this);
      auto new_node = inode_4::create(*this, *node, shared_prefix_len, depth,
                                      std::move(leaf));
      *node = detail::node_ptr{new_node.release(), node_type::I4};
#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
      ++key_prefix_splits;
      UNODB_DETAIL_ASSERT(growing_inode_counts[internal_as_i<node_type::I4>] >
                          key_prefix_splits);
#endif  // UNODB_DETAIL_WITH_STATS
      return true;
    }
    // key_prefix bytes were absorbed during the descent.  Now we need
    // to either descend along an existing child or create a new child.
    UNODB_DETAIL_ASSERT(shared_prefix_len == key_prefix_length);
    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    node = inode->template add_or_choose_subtree<detail::node_ptr*>(
        node_type, remaining_key[0], k, v, *this, depth, node);

    if (node == nullptr) return true;

    ++depth;
    remaining_key.shift_right(1);
  }
}